

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O2

FT_Error af_cjk_metrics_init(AF_CJKMetrics metrics,FT_Face face)

{
  ushort uVar1;
  ushort uVar2;
  AF_Blue_Stringset AVar3;
  uint uVar4;
  FT_CharMap charmap;
  FT_GlyphSlot_conflict pFVar5;
  FT_Vector *pFVar6;
  FT_Error FVar7;
  long *buf;
  long lVar8;
  char cVar9;
  AF_CJKBlueRec *pAVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  FT_UInt count;
  FT_Pos *pFVar16;
  FT_Vector *pFVar17;
  char *pcVar18;
  char *p;
  AF_Blue_StringRec *pAVar19;
  AF_CJKAxisRec *pAVar20;
  FT_UInt count_00;
  long lVar21;
  FT_Pos local_3d8;
  FT_Pos fills [51];
  FT_Pos local_238;
  FT_Pos flats [51];
  uint local_54;
  ulong local_50;
  ulong local_48;
  long *local_40;
  undefined4 local_34;
  
  charmap = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar7 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  if (FVar7 == 0) {
    af_cjk_metrics_init_widths(metrics,face);
    AVar3 = ((metrics->root).style_class)->blue_stringset;
    buf = (long *)af_shaper_buf_create(face);
    local_40 = buf;
    for (pAVar19 = af_blue_stringsets + AVar3; (ulong)pAVar19->string != 0x1429;
        pAVar19 = pAVar19 + 1) {
      pcVar18 = af_blue_strings + pAVar19->string;
      uVar1 = pAVar19->properties;
      local_48 = 0;
      local_34 = 0x261601;
      local_50 = 0;
      while( true ) {
        cVar9 = *pcVar18;
        p = pcVar18;
        if (cVar9 == '\0') break;
        while (pcVar18 = p + 1, cVar9 == ' ') {
          p = pcVar18;
          cVar9 = *pcVar18;
        }
        if (cVar9 == '|') {
          local_34 = 0;
        }
        else {
          pcVar18 = af_shaper_get_cluster(p,&metrics->root,buf,&local_54);
          if ((((local_54 < 2) && (*buf != 0)) &&
              (FVar7 = FT_Load_Glyph(face,(FT_UInt)*buf,1), buf = local_40, FVar7 == 0)) &&
             (pFVar5 = face->glyph, 2 < (pFVar5->outline).n_points)) {
            pFVar6 = (pFVar5->outline).points;
            uVar2 = (pFVar5->outline).n_contours;
            uVar11 = 0;
            if ((short)uVar2 < 1) {
              uVar2 = 0;
            }
            lVar8 = 0;
            uVar12 = 0xffffffffffffffff;
            iVar14 = 0;
            for (; uVar11 != uVar2; uVar11 = uVar11 + 1) {
              iVar13 = (int)(pFVar5->outline).contours[uVar11];
              if (iVar14 < iVar13) {
                uVar15 = (ulong)iVar14;
                lVar21 = (long)iVar13;
                if ((uVar1 & 2) == 0) {
                  if ((uVar1 & 1) == 0) {
                    pFVar16 = &pFVar6[uVar15].y;
                    for (; (long)uVar15 <= lVar21; uVar15 = uVar15 + 1) {
                      if (*pFVar16 < lVar8 || (int)uVar12 < 0) {
                        uVar12 = uVar15;
                        lVar8 = *pFVar16;
                      }
                      uVar12 = uVar12 & 0xffffffff;
                      pFVar16 = pFVar16 + 2;
                    }
                  }
                  else {
                    pFVar16 = &pFVar6[uVar15].y;
                    for (; (long)uVar15 <= lVar21; uVar15 = uVar15 + 1) {
                      if (lVar8 < *pFVar16 || (int)uVar12 < 0) {
                        uVar12 = uVar15;
                        lVar8 = *pFVar16;
                      }
                      uVar12 = uVar12 & 0xffffffff;
                      pFVar16 = pFVar16 + 2;
                    }
                  }
                }
                else if ((uVar1 & 1) == 0) {
                  pFVar17 = pFVar6 + uVar15;
                  for (; (long)uVar15 <= lVar21; uVar15 = uVar15 + 1) {
                    if (pFVar17->x < lVar8 || (int)uVar12 < 0) {
                      uVar12 = uVar15;
                      lVar8 = pFVar17->x;
                    }
                    uVar12 = uVar12 & 0xffffffff;
                    pFVar17 = pFVar17 + 1;
                  }
                }
                else {
                  pFVar17 = pFVar6 + uVar15;
                  for (; (long)uVar15 <= lVar21; uVar15 = uVar15 + 1) {
                    if (lVar8 < pFVar17->x || (int)uVar12 < 0) {
                      uVar12 = uVar15;
                      lVar8 = pFVar17->x;
                    }
                    uVar12 = uVar12 & 0xffffffff;
                    pFVar17 = pFVar17 + 1;
                  }
                }
              }
              iVar14 = iVar13 + 1;
            }
            if ((char)local_34 == '\0') {
              uVar11 = local_48 & 0xffffffff;
              local_48 = (ulong)((int)local_48 + 1);
              flats[uVar11 - 1] = lVar8;
              local_34 = 0;
              buf = local_40;
            }
            else {
              uVar11 = local_50 & 0xffffffff;
              local_50 = (ulong)((int)local_50 + 1);
              fills[uVar11 - 1] = lVar8;
              buf = local_40;
            }
          }
        }
      }
      count_00 = (FT_UInt)local_48;
      count = (FT_UInt)local_50;
      if (count_00 != 0 || count != 0) {
        pAVar20 = metrics->axis;
        if ((uVar1 & 2) == 0) {
          pAVar20 = metrics->axis + 1;
        }
        af_sort_pos(count,&local_3d8);
        af_sort_pos(count_00,&local_238);
        uVar4 = pAVar20->blue_count;
        pAVar10 = pAVar20->blues + uVar4;
        pAVar20->blue_count = uVar4 + 1;
        if (count_00 == 0) {
          lVar8 = fills[(ulong)(count >> 1) - 1];
LAB_002318cb:
          pAVar20->blues[uVar4].shoot.org = lVar8;
          (pAVar10->ref).org = lVar8;
          lVar21 = lVar8;
        }
        else {
          if (count == 0) {
            lVar8 = flats[(ulong)(count_00 >> 1) - 1];
            goto LAB_002318cb;
          }
          lVar21 = fills[(ulong)(count >> 1) - 1];
          (pAVar10->ref).org = lVar21;
          lVar8 = flats[(ulong)(count_00 >> 1) - 1];
          pAVar20->blues[uVar4].shoot.org = lVar8;
        }
        if ((lVar8 != lVar21) && (((lVar21 <= lVar8 ^ (byte)uVar1) & 1) == 0)) {
          lVar8 = (lVar8 + lVar21) / 2;
          pAVar20->blues[uVar4].shoot.org = lVar8;
          (pAVar10->ref).org = lVar8;
        }
        pAVar20->blues[uVar4].flags = (uint)uVar1 * 2 & 2;
        buf = local_40;
      }
    }
    af_shaper_buf_destroy(face,buf);
    af_cjk_metrics_check_digits(metrics,face);
  }
  FT_Set_Charmap(face,charmap);
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_cjk_metrics_init( AF_CJKMetrics  metrics,
                       FT_Face        face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_cjk_metrics_init_widths( metrics, face );
      af_cjk_metrics_init_blues( metrics, face );
      af_cjk_metrics_check_digits( metrics, face );
    }

    FT_Set_Charmap( face, oldmap );
    return FT_Err_Ok;
  }